

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

yyjson_mut_val *
duckdb_yyjson::yyjson_patch
          (yyjson_mut_doc *doc,yyjson_val *orig,yyjson_val *patch,yyjson_patch_err *err)

{
  bool bVar1;
  bool bVar2;
  patch_op pVar3;
  yyjson_ptr_code yVar4;
  yyjson_ptr_err *err_00;
  yyjson_mut_val *val;
  char **ppcVar5;
  char *pcVar6;
  ulong uVar7;
  yyjson_mut_val *lhs;
  yyjson_val *pyVar8;
  yyjson_mut_val *pyVar9;
  size_t sVar10;
  char *pcVar11;
  yyjson_val *pyVar12;
  yyjson_val *pyVar13;
  ulong uVar14;
  yyjson_val *pyVar15;
  ulong local_90;
  ulong local_70;
  yyjson_patch_err err_tmp;
  
  if (err == (yyjson_patch_err *)0x0) {
    err = &err_tmp;
    err_00 = &err_tmp.ptr;
  }
  else {
    err_00 = &err->ptr;
  }
  (err->ptr).msg = (char *)0x0;
  (err->ptr).pos = 0;
  err->msg = (char *)0x0;
  *(undefined8 *)&err->ptr = 0;
  *(undefined8 *)err = 0;
  err->idx = 0;
  if (((doc == (yyjson_mut_doc *)0x0) || (orig == (yyjson_val *)0x0)) ||
     (patch == (yyjson_val *)0x0)) {
    if ((err->ptr).code != 6) {
      err->code = 1;
      pcVar6 = "input parameter is NULL";
LAB_018b9488:
      err->msg = pcVar6;
LAB_018b948d:
      err->idx = 0;
      return (yyjson_mut_val *)0x0;
    }
    err->code = 2;
    pcVar6 = "input parameter is NULL";
  }
  else {
    if ((patch->tag & 7) == 6) {
      val = yyjson_val_mut_copy(doc,orig);
      if (val != (yyjson_mut_val *)0x0) {
        if ((patch->tag & 7) == 6) {
          local_70 = patch->tag >> 8;
          pyVar15 = patch + 1;
        }
        else {
          local_70 = 0;
          pyVar15 = (yyjson_val *)0x0;
        }
        ppcVar5 = &err_00->msg;
        local_90 = 0;
        do {
          if (local_90 < local_70) {
            pcVar6 = (char *)0x10;
            if ((~(uint)pyVar15->tag & 6) == 0) {
              pcVar6 = (pyVar15->uni).str;
            }
            local_90 = local_90 + 1;
            pyVar12 = pyVar15;
            pyVar15 = (yyjson_val *)(pcVar6 + (long)pyVar15);
          }
          else {
            pyVar12 = (yyjson_val *)0x0;
          }
          if (pyVar12 == (yyjson_val *)0x0) {
            return val;
          }
          uVar14 = pyVar12->tag;
          if ((~(uint)uVar14 & 7) != 0) {
            if ((err->ptr).code != 6) {
              err->code = 3;
              pcVar6 = "JSON patch operation is not object";
              goto LAB_018b93cb;
            }
            err->code = 2;
            pcVar6 = "JSON patch operation is not object";
            goto LAB_018b938b;
          }
          if (0xff < uVar14) {
            uVar7 = uVar14 >> 8;
            pyVar13 = pyVar12;
            do {
              if (((pyVar13[1].tag & 0xffffffffffffff00) == 0x200) &&
                 (*(short *)pyVar13[1].uni.str == 0x706f)) {
                pyVar13 = pyVar13 + 2;
                goto LAB_018b8744;
              }
              pcVar6 = (char *)0x10;
              if ((~(uint)pyVar13[2].tag & 6) == 0) {
                pcVar6 = pyVar13[2].uni.str;
              }
              pyVar13 = (yyjson_val *)(pcVar6 + (long)&pyVar13[1].tag);
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
          pyVar13 = (yyjson_val *)0x0;
LAB_018b8744:
          if (pyVar13 == (yyjson_val *)0x0) {
            if ((err->ptr).code == 6) {
              err->code = 2;
              pcVar6 = "missing key `op`";
              goto LAB_018b8eba;
            }
            err->code = 4;
            pcVar6 = "missing key `op`";
LAB_018b8f2d:
            err->msg = pcVar6;
LAB_018b8f32:
            sVar10 = 0;
            if (local_90 != 0) {
              sVar10 = local_90 - 1;
            }
            err->idx = sVar10;
LAB_018b8f4c:
            bVar1 = false;
            lhs = val;
          }
          else {
            if ((pyVar13->tag & 7) != 5) {
              if ((err->ptr).code != 6) {
                err->code = 5;
                pcVar6 = "invalid member `op`";
                goto LAB_018b8f2d;
              }
              err->code = 2;
              pcVar6 = "invalid member `op`";
LAB_018b8eba:
              err->msg = pcVar6;
LAB_018b8ebf:
              *(undefined8 *)err_00 = 0;
              err_00->msg = (char *)0x0;
              err_00->pos = 0;
              goto LAB_018b8f4c;
            }
            pVar3 = patch_op_get(pyVar13);
            if (0xff < uVar14) {
              uVar7 = uVar14 >> 8;
              pyVar13 = pyVar12;
              do {
                if (((pyVar13[1].tag & 0xffffffffffffff00) == 0x400) &&
                   (*(int *)pyVar13[1].uni.str == 0x68746170)) {
                  pyVar13 = pyVar13 + 2;
                  goto LAB_018b87bd;
                }
                pcVar6 = (char *)0x10;
                if ((~(uint)pyVar13[2].tag & 6) == 0) {
                  pcVar6 = pyVar13[2].uni.str;
                }
                pyVar13 = (yyjson_val *)(pcVar6 + (long)&pyVar13[1].tag);
                uVar7 = uVar7 - 1;
              } while (uVar7 != 0);
            }
            pyVar13 = (yyjson_val *)0x0;
LAB_018b87bd:
            if (pyVar13 == (yyjson_val *)0x0) {
              if ((err->ptr).code != 6) {
                err->code = 4;
                pcVar6 = "missing key `path`";
                goto LAB_018b8f2d;
              }
              err->code = 2;
              pcVar6 = "missing key `path`";
              goto LAB_018b8eba;
            }
            if ((pyVar13->tag & 7) != 5) {
              if ((err->ptr).code != 6) {
                err->code = 5;
                pcVar6 = "invalid member `path`";
                goto LAB_018b8f2d;
              }
              err->code = 2;
              pcVar6 = "invalid member `path`";
              goto LAB_018b8eba;
            }
            uVar7 = pyVar13->tag;
            if (pVar3 < PATCH_OP_NONE) {
              if ((0x25U >> (pVar3 & 0x1f) & 1) == 0) {
                pyVar8 = (yyjson_val *)0x0;
                lhs = (yyjson_mut_val *)0x0;
                sVar10 = 0;
                if ((0x18U >> (pVar3 & 0x1f) & 1) == 0) goto LAB_018b8951;
                if (uVar14 < 0x100) {
                  pyVar8 = (yyjson_val *)0x0;
                }
                else {
                  uVar14 = uVar14 >> 8;
                  do {
                    if (((pyVar12[1].tag & 0xffffffffffffff00) == 0x400) &&
                       (*(int *)pyVar12[1].uni.str == 0x6d6f7266)) {
                      pyVar8 = pyVar12 + 2;
                      goto LAB_018b892b;
                    }
                    pcVar6 = (char *)0x10;
                    if ((~(uint)pyVar12[2].tag & 6) == 0) {
                      pcVar6 = pyVar12[2].uni.str;
                    }
                    pyVar12 = (yyjson_val *)(pcVar6 + (long)&pyVar12[1].tag);
                    uVar14 = uVar14 - 1;
                  } while (uVar14 != 0);
                  pyVar8 = (yyjson_val *)0x0;
                }
LAB_018b892b:
                if (pyVar8 == (yyjson_val *)0x0) {
                  if ((err->ptr).code != 6) {
                    err->code = 4;
                    pcVar6 = "missing key `from`";
                    goto LAB_018b93cb;
                  }
                  err->code = 2;
                  pcVar6 = "missing key `from`";
                }
                else {
                  if ((pyVar8->tag & 7) == 5) {
                    sVar10 = pyVar8->tag >> 8;
                    lhs = (yyjson_mut_val *)0x0;
                    goto LAB_018b8951;
                  }
                  if ((err->ptr).code != 6) {
                    err->code = 5;
                    pcVar6 = "invalid member `from`";
                    goto LAB_018b93cb;
                  }
                  err->code = 2;
                  pcVar6 = "invalid member `from`";
                }
LAB_018b938b:
                err->msg = pcVar6;
LAB_018b9390:
                *(undefined8 *)err_00 = 0;
                err_00->msg = (char *)0x0;
                err_00->pos = 0;
                bVar1 = false;
                lhs = val;
                goto LAB_018b8df5;
              }
              if (0xff < uVar14) {
                uVar14 = uVar14 >> 8;
                do {
                  if (((pyVar12[1].tag & 0xffffffffffffff00) == 0x500) &&
                     ((char)*(int *)((long)pyVar12[1].uni.str + 4) == 'e' &&
                      *(int *)pyVar12[1].uni.str == 0x756c6176)) {
                    pyVar12 = pyVar12 + 2;
                    goto LAB_018b884c;
                  }
                  pcVar6 = (char *)0x10;
                  if ((~(uint)pyVar12[2].tag & 6) == 0) {
                    pcVar6 = pyVar12[2].uni.str;
                  }
                  pyVar12 = (yyjson_val *)(pcVar6 + (long)&pyVar12[1].tag);
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
              pyVar12 = (yyjson_val *)0x0;
LAB_018b884c:
              if (pyVar12 == (yyjson_val *)0x0) {
                if ((err->ptr).code != 6) {
                  err->code = 4;
                  pcVar6 = "missing key `value`";
                  goto LAB_018b93cb;
                }
                err->code = 2;
                pcVar6 = "missing key `value`";
                goto LAB_018b938b;
              }
              lhs = yyjson_val_mut_copy(doc,pyVar12);
              if (lhs != (yyjson_mut_val *)0x0) {
                pyVar8 = (yyjson_val *)0x0;
                sVar10 = 0;
                goto LAB_018b8951;
              }
              yVar4 = (err->ptr).code;
              err->code = 2;
              err->msg = "failed to copy value";
              if (yVar4 != 6) goto LAB_018b8f32;
              goto LAB_018b8ebf;
            }
            pyVar8 = (yyjson_val *)0x0;
            lhs = (yyjson_mut_val *)0x0;
            sVar10 = 0;
LAB_018b8951:
            if (PATCH_OP_TEST < pVar3) {
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar6 = "unsupported `op`";
LAB_018b8da4:
                err->msg = pcVar6;
                *(undefined8 *)err_00 = 0;
                err_00->msg = (char *)0x0;
                err_00->pos = 0;
                bVar1 = false;
                lhs = val;
              }
              else {
                err->code = 5;
                pcVar6 = "unsupported `op`";
LAB_018b8dd0:
                err->msg = pcVar6;
                bVar1 = false;
                sVar10 = 0;
                if (local_90 != 0) {
                  sVar10 = local_90 - 1;
                }
                err->idx = sVar10;
                lhs = val;
              }
              goto LAB_018b8df5;
            }
            uVar14 = uVar7 >> 8;
            switch(pVar3) {
            case PATCH_OP_ADD:
              bVar1 = true;
              if (uVar7 < 0x100) {
LAB_018b8fed:
                bVar1 = true;
                goto LAB_018b8df5;
              }
              pcVar6 = (pyVar13->uni).str;
              (err->ptr).code = 0;
              *ppcVar5 = (char *)0x0;
              err_00->pos = 0;
              yVar4 = 1;
              if ((lhs == (yyjson_mut_val *)0x0) || (val == (yyjson_mut_val *)0x0)) {
                pcVar11 = "input parameter is NULL";
LAB_018b92f7:
                (err->ptr).code = yVar4;
                err_00->msg = pcVar11;
                err_00->pos = 0;
              }
              else {
                pcVar11 = "input parameter is NULL";
                if (pcVar6 == (char *)0x0) goto LAB_018b92f7;
                if (*pcVar6 != '/') {
                  yVar4 = 2;
                  pcVar11 = "no prefix \'/\'";
                  goto LAB_018b92f7;
                }
                bVar2 = unsafe_yyjson_mut_ptr_putx
                                  (val,pcVar6,uVar14,lhs,doc,false,true,(yyjson_ptr_ctx *)0x0,err_00
                                  );
                lhs = val;
                if (bVar2) goto LAB_018b8df5;
              }
              if ((err->ptr).code == 6) {
LAB_018b9289:
                err->code = 2;
                pcVar6 = "failed to add `path`";
                goto LAB_018b938b;
              }
LAB_018b931f:
              err->code = 7;
              pcVar6 = "failed to add `path`";
              break;
            case PATCH_OP_REMOVE:
              pcVar6 = (pyVar13->uni).str;
              (err->ptr).code = 0;
              *ppcVar5 = (char *)0x0;
              err_00->pos = 0;
              yVar4 = 1;
              pcVar11 = "input parameter is NULL";
              if ((val == (yyjson_mut_val *)0x0) || (pcVar6 == (char *)0x0)) {
LAB_018b935e:
                (err->ptr).code = yVar4;
                err_00->msg = pcVar11;
                err_00->pos = 0;
              }
              else {
                if (uVar7 < 0x100) {
                  yVar4 = 5;
                  pcVar11 = "cannot set root";
                  goto LAB_018b935e;
                }
                if (*pcVar6 != '/') {
                  yVar4 = 2;
                  pcVar11 = "no prefix \'/\'";
                  goto LAB_018b935e;
                }
                pyVar9 = unsafe_yyjson_mut_ptr_removex
                                   (val,pcVar6,uVar14,(yyjson_ptr_ctx *)0x0,err_00);
                bVar1 = true;
                lhs = val;
                if (pyVar9 != (yyjson_mut_val *)0x0) goto LAB_018b8df5;
              }
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar6 = "failed to remove `path`";
                goto LAB_018b938b;
              }
              err->code = 7;
              pcVar6 = "failed to remove `path`";
              break;
            case PATCH_OP_REPLACE:
              bVar1 = true;
              if (uVar7 < 0x100) goto LAB_018b8fed;
              pcVar6 = (pyVar13->uni).str;
              (err->ptr).code = 0;
              *ppcVar5 = (char *)0x0;
              err_00->pos = 0;
              yVar4 = 1;
              if ((lhs == (yyjson_mut_val *)0x0) || (val == (yyjson_mut_val *)0x0)) {
                pcVar11 = "input parameter is NULL";
LAB_018b92a4:
                (err->ptr).code = yVar4;
                err_00->msg = pcVar11;
                err_00->pos = 0;
              }
              else {
                pcVar11 = "input parameter is NULL";
                if (pcVar6 == (char *)0x0) goto LAB_018b92a4;
                if (*pcVar6 != '/') {
                  yVar4 = 2;
                  pcVar11 = "no prefix \'/\'";
                  goto LAB_018b92a4;
                }
                pyVar9 = unsafe_yyjson_mut_ptr_replacex
                                   (val,pcVar6,uVar14,lhs,(yyjson_ptr_ctx *)0x0,err_00);
                lhs = val;
                if (pyVar9 != (yyjson_mut_val *)0x0) goto LAB_018b8df5;
              }
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar6 = "failed to replace `path`";
                goto LAB_018b938b;
              }
              err->code = 7;
              pcVar6 = "failed to replace `path`";
              break;
            case PATCH_OP_MOVE:
              lhs = val;
              if (sVar10 == 0 && uVar14 == 0) goto LAB_018b8fed;
              pcVar6 = (pyVar8->uni).str;
              (err->ptr).code = 0;
              *ppcVar5 = (char *)0x0;
              err_00->pos = 0;
              if ((val == (yyjson_mut_val *)0x0) || (pcVar6 == (char *)0x0)) {
                (err->ptr).code = 1;
                pcVar6 = "input parameter is NULL";
LAB_018b9235:
                err_00->msg = pcVar6;
                err_00->pos = 0;
                lhs = (yyjson_mut_val *)0x0;
              }
              else {
                if (sVar10 == 0) {
                  (err->ptr).code = 5;
                  pcVar6 = "cannot set root";
                  goto LAB_018b9235;
                }
                if (*pcVar6 != '/') {
                  (err->ptr).code = 2;
                  pcVar6 = "no prefix \'/\'";
                  goto LAB_018b9235;
                }
                lhs = unsafe_yyjson_mut_ptr_removex(val,pcVar6,sVar10,(yyjson_ptr_ctx *)0x0,err_00);
              }
              if (lhs != (yyjson_mut_val *)0x0) {
                if (uVar7 < 0x100) {
                  bVar1 = true;
                  goto LAB_018b8df5;
                }
                pcVar6 = (pyVar13->uni).str;
                (err->ptr).code = 0;
                *ppcVar5 = (char *)0x0;
                err_00->pos = 0;
                yVar4 = 1;
                pcVar11 = "input parameter is NULL";
                if ((val == (yyjson_mut_val *)0x0) || (pcVar6 == (char *)0x0)) {
LAB_018b9267:
                  (err->ptr).code = yVar4;
LAB_018b926c:
                  err_00->msg = pcVar11;
                  err_00->pos = 0;
                }
                else {
                  if (*pcVar6 != '/') {
                    yVar4 = 2;
                    pcVar11 = "no prefix \'/\'";
                    goto LAB_018b9267;
                  }
LAB_018b8c4a:
                  bVar1 = true;
                  bVar2 = unsafe_yyjson_mut_ptr_putx
                                    (val,pcVar6,uVar14,lhs,doc,false,true,(yyjson_ptr_ctx *)0x0,
                                     err_00);
                  lhs = val;
                  if (bVar2) goto LAB_018b8df5;
                }
                if ((err->ptr).code != 6) goto LAB_018b931f;
                goto LAB_018b9289;
              }
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar6 = "failed to remove `from`";
                goto LAB_018b938b;
              }
              err->code = 7;
              pcVar6 = "failed to remove `from`";
              break;
            case PATCH_OP_COPY:
              pcVar6 = (pyVar8->uni).str;
              (err->ptr).code = 0;
              *ppcVar5 = (char *)0x0;
              err_00->pos = 0;
              if ((val == (yyjson_mut_val *)0x0) || (pcVar6 == (char *)0x0)) {
                (err->ptr).code = 1;
                err_00->msg = "input parameter is NULL";
                err_00->pos = 0;
                lhs = (yyjson_mut_val *)0x0;
              }
              else {
                lhs = val;
                if (sVar10 != 0) {
                  if (*pcVar6 == '/') {
                    lhs = unsafe_yyjson_mut_ptr_getx(val,pcVar6,sVar10,(yyjson_ptr_ctx *)0x0,err_00)
                    ;
                  }
                  else {
                    (err->ptr).code = 2;
                    err_00->msg = "no prefix \'/\'";
                    err_00->pos = 0;
                    lhs = (yyjson_mut_val *)0x0;
                  }
                }
              }
              if (lhs == (yyjson_mut_val *)0x0) {
                if ((err->ptr).code == 6) {
                  err->code = 2;
                  pcVar6 = "failed to get `from`";
                  goto LAB_018b938b;
                }
                err->code = 7;
                pcVar6 = "failed to get `from`";
                break;
              }
              bVar1 = true;
              if (uVar7 < 0x100) goto LAB_018b8df5;
              if (doc == (yyjson_mut_doc *)0x0) {
                lhs = (yyjson_mut_val *)0x0;
              }
              else {
                lhs = unsafe_yyjson_mut_val_mut_copy(doc,lhs);
              }
              if (lhs != (yyjson_mut_val *)0x0) {
                pcVar6 = (pyVar13->uni).str;
                (err->ptr).code = 0;
                *ppcVar5 = (char *)0x0;
                err_00->pos = 0;
                yVar4 = 1;
                pcVar11 = "input parameter is NULL";
                if ((val != (yyjson_mut_val *)0x0) && (pcVar6 != (char *)0x0)) {
                  if (*pcVar6 != '/') {
                    yVar4 = 2;
                    pcVar11 = "no prefix \'/\'";
                    goto LAB_018b9254;
                  }
                  goto LAB_018b8c4a;
                }
LAB_018b9254:
                (err->ptr).code = yVar4;
                goto LAB_018b926c;
              }
              yVar4 = (err->ptr).code;
              err->code = 2;
              err->msg = "failed to copy value";
              if (yVar4 == 6) goto LAB_018b9390;
              goto LAB_018b93d0;
            case PATCH_OP_TEST:
              pcVar6 = (pyVar13->uni).str;
              (err->ptr).code = 0;
              *ppcVar5 = (char *)0x0;
              err_00->pos = 0;
              if ((val == (yyjson_mut_val *)0x0) || (pcVar6 == (char *)0x0)) {
                (err->ptr).code = 1;
                pcVar6 = "input parameter is NULL";
LAB_018b920a:
                err_00->msg = pcVar6;
                err_00->pos = 0;
                pyVar9 = (yyjson_mut_val *)0x0;
              }
              else {
                pyVar9 = val;
                if (0xff < uVar7) {
                  if (*pcVar6 != '/') {
                    (err->ptr).code = 2;
                    pcVar6 = "no prefix \'/\'";
                    goto LAB_018b920a;
                  }
                  pyVar9 = unsafe_yyjson_mut_ptr_getx
                                     (val,pcVar6,uVar14,(yyjson_ptr_ctx *)0x0,err_00);
                }
              }
              if (pyVar9 != (yyjson_mut_val *)0x0) {
                if (lhs != (yyjson_mut_val *)0x0) {
                  bVar2 = unsafe_yyjson_mut_equals(lhs,pyVar9);
                  bVar1 = true;
                  lhs = val;
                  if (bVar2) goto LAB_018b8df5;
                }
                if ((err->ptr).code != 6) {
                  err->code = 6;
                  pcVar6 = "failed to test equal";
                  goto LAB_018b8dd0;
                }
                err->code = 2;
                pcVar6 = "failed to test equal";
                goto LAB_018b8da4;
              }
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar6 = "failed to get `path`";
                goto LAB_018b938b;
              }
              err->code = 7;
              pcVar6 = "failed to get `path`";
            }
LAB_018b93cb:
            err->msg = pcVar6;
LAB_018b93d0:
            bVar1 = false;
            sVar10 = 0;
            if (local_90 != 0) {
              sVar10 = local_90 - 1;
            }
            err->idx = sVar10;
            lhs = val;
          }
LAB_018b8df5:
          val = lhs;
          if (!bVar1) {
            return (yyjson_mut_val *)0x0;
          }
        } while( true );
      }
      yVar4 = (err->ptr).code;
      err->code = 2;
      err->msg = "failed to copy value";
      if (yVar4 != 6) goto LAB_018b948d;
      goto LAB_018b9445;
    }
    if ((err->ptr).code != 6) {
      err->code = 1;
      pcVar6 = "input patch is not array";
      goto LAB_018b9488;
    }
    err->code = 2;
    pcVar6 = "input patch is not array";
  }
  err->msg = pcVar6;
LAB_018b9445:
  *(undefined8 *)err_00 = 0;
  err_00->msg = (char *)0x0;
  err_00->pos = 0;
  return (yyjson_mut_val *)0x0;
}

Assistant:

yyjson_mut_val *yyjson_patch(yyjson_mut_doc *doc,
                             yyjson_val *orig,
                             yyjson_val *patch,
                             yyjson_patch_err *err) {

    yyjson_mut_val *root;
    yyjson_val *obj;
    yyjson_arr_iter iter;
    yyjson_patch_err err_tmp;
    if (!err) err = &err_tmp;
    memset(err, 0, sizeof(*err));
    memset(&iter, 0, sizeof(iter));

    if (unlikely(!doc || !orig || !patch)) {
        return_err(INVALID_PARAMETER, "input parameter is NULL");
    }
    if (unlikely(!yyjson_is_arr(patch))) {
        return_err(INVALID_PARAMETER, "input patch is not array");
    }
    root = yyjson_val_mut_copy(doc, orig);
    if (unlikely(!root)) return_err_copy();

    /* iterate through the patch array */
    yyjson_arr_iter_init(patch, &iter);
    while ((obj = yyjson_arr_iter_next(&iter))) {
        patch_op op_enum;
        yyjson_val *op, *path, *from = NULL, *value;
        yyjson_mut_val *val = NULL, *test;
        usize path_len, from_len = 0;
        if (unlikely(!unsafe_yyjson_is_obj(obj))) {
            return_err(INVALID_OPERATION, "JSON patch operation is not object");
        }

        /* get required member: op */
        op = yyjson_obj_get(obj, "op");
        if (unlikely(!op)) return_err_key("`op`");
        if (unlikely(!yyjson_is_str(op))) return_err_val("`op`");
        op_enum = patch_op_get(op);

        /* get required member: path */
        path = yyjson_obj_get(obj, "path");
        if (unlikely(!path)) return_err_key("`path`");
        if (unlikely(!yyjson_is_str(path))) return_err_val("`path`");
        path_len = unsafe_yyjson_get_len(path);

        /* get required member: value, from */
        switch ((int)op_enum) {
            case PATCH_OP_ADD: case PATCH_OP_REPLACE: case PATCH_OP_TEST:
                value = yyjson_obj_get(obj, "value");
                if (unlikely(!value)) return_err_key("`value`");
                val = yyjson_val_mut_copy(doc, value);
                if (unlikely(!val)) return_err_copy();
                break;
            case PATCH_OP_MOVE: case PATCH_OP_COPY:
                from = yyjson_obj_get(obj, "from");
                if (unlikely(!from)) return_err_key("`from`");
                if (unlikely(!yyjson_is_str(from))) return_err_val("`from`");
                from_len = unsafe_yyjson_get_len(from);
                break;
            default:
                break;
        }

        /* perform an operation */
        switch ((int)op_enum) {
            case PATCH_OP_ADD: /* add(path, val) */
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_REMOVE: /* remove(path) */
                if (unlikely(!ptr_remove(path))) {
                    return_err(POINTER, "failed to remove `path`");
                }
                break;
            case PATCH_OP_REPLACE: /* replace(path, val) */
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_replace(path, val))) {
                    return_err(POINTER, "failed to replace `path`");
                }
                break;
            case PATCH_OP_MOVE: /* val = remove(from), add(path, val) */
                if (unlikely(from_len == 0 && path_len == 0)) break;
                val = ptr_remove(from);
                if (unlikely(!val)) {
                    return_err(POINTER, "failed to remove `from`");
                }
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_COPY: /* val = get(from).copy, add(path, val) */
                val = ptr_get(from);
                if (unlikely(!val)) {
                    return_err(POINTER, "failed to get `from`");
                }
                if (unlikely(path_len == 0)) { root = val; break; }
                val = yyjson_mut_val_mut_copy(doc, val);
                if (unlikely(!val)) return_err_copy();
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_TEST: /* test = get(path), test.eq(val) */
                test = ptr_get(path);
                if (unlikely(!test)) {
                    return_err(POINTER, "failed to get `path`");
                }
                if (unlikely(!yyjson_mut_equals(val, test))) {
                    return_err(EQUAL, "failed to test equal");
                }
                break;
            default:
                return_err(INVALID_MEMBER, "unsupported `op`");
        }
    }
    return root;
}